

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void labeltype_cb(Fl_Choice *i,void *v)

{
  byte bVar1;
  Fl_Menu_Item *pFVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  void **ppvVar6;
  Fl_Widget_Type *p;
  Fl_Widget_Type *this;
  bool bVar7;
  
  if ((char *)v == "LOAD") {
    bVar1 = (current_widget->o->label_).type;
    (i->super_Fl_Menu_).super_Fl_Widget.when_ = '\x04';
    ppvVar6 = &labeltypemenu[0].user_data_;
    lVar5 = 0;
    do {
      if (*ppvVar6 == (void *)(ulong)bVar1) {
        Fl_Choice::value(i,(int)lVar5);
        return;
      }
      lVar5 = lVar5 + 1;
      ppvVar6 = ppvVar6 + 7;
    } while (lVar5 != 6);
  }
  else {
    pFVar2 = (i->super_Fl_Menu_).value_;
    if (pFVar2 == (Fl_Menu_Item *)0x0) {
      lVar5 = -1;
    }
    else {
      lVar5 = (long)((int)((ulong)((long)pFVar2 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                    -0x49249249);
    }
    pvVar3 = labeltypemenu[lVar5].user_data_;
    if ((-1 < (int)pvVar3) && (Fl_Type::first != (Fl_Type *)0x0)) {
      bVar7 = true;
      this = (Fl_Widget_Type *)Fl_Type::first;
      do {
        while (((this->super_Fl_Type).selected != '\0' &&
               (iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar4 != 0))) {
          (this->o->label_).type = (uchar)pvVar3;
          Fl_Widget_Type::redraw(this);
          this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
          bVar7 = false;
          if (this == (Fl_Widget_Type *)0x0) goto LAB_00184e3b;
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (!bVar7) {
LAB_00184e3b:
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void labeltype_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n;
    n = current_widget->o->labeltype();
    i->when(FL_WHEN_RELEASE);
    for (int j = 0; j < int(sizeof(labeltypemenu)/sizeof(*labeltypemenu)); j++)
      if (labeltypemenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(labeltypemenu[m].argument());
    if (n<0) return; // should not happen
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* p = (Fl_Widget_Type*)o;
	p->o->labeltype((Fl_Labeltype)n);
	p->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}